

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_CreateCatIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Con)

{
  int *piVar1;
  Cba_Man_t *pCVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int Fill;
  int Fill_00;
  int Fill_01;
  long lVar8;
  int iVar9;
  
  if ((-1 < Con) && (uVar3 = (pNtk->vConcats).nSize, Con < (int)uVar3)) {
    piVar1 = (pNtk->vConcats).pArray;
    Prs_CatSignals_V_1 = piVar1[(uint)Con];
    if (uVar3 <= Con + 1U) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    Prs_CatSignals_V_2 = piVar1 + (Con + 1U);
    uVar3 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,Prs_CatSignals_V_1,1);
    if ((int)uVar3 < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
    }
    if ((int)uVar3 < (p->vObjFon0).nSize) {
      iVar9 = (p->vObjFon0).pArray[uVar3];
      uVar4 = Cba_NtkNewStrId(p,"_icc%d_",(ulong)uVar3);
      Cba_FonSetName(p,iVar9,uVar4);
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar4 + 1,Fill);
      if ((-1 < (int)uVar4) && ((int)uVar4 < (pCVar2->vNameMap).nSize)) {
        if ((pCVar2->vNameMap).pArray[uVar4] != 0) {
          __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
        }
        Vec_IntFillExtra(&pCVar2->vNameMap,uVar4 + 1,Fill_00);
        if ((pCVar2->vNameMap).nSize <= (int)uVar4) {
LAB_003ba0cc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (pCVar2->vNameMap).pArray[uVar4] = iVar9;
        Vec_IntPush(&pCVar2->vUsed,uVar4);
        if (Prs_CatSignals_V_1 < 1) {
          iVar9 = -1;
        }
        else {
          lVar8 = 0;
          iVar9 = 0;
          do {
            iVar5 = Prs_CreateSignalIn(p,pNtk,Prs_CatSignals_V_2[lVar8]);
            if (iVar5 != 0) {
              if ((p->vObjFin0).nSize <= (int)uVar3) goto LAB_003ba06f;
              uVar7 = (ulong)(uint)(p->vObjFin0).pArray[uVar3] + lVar8;
              iVar6 = (int)uVar7;
              if (iVar6 < 1) {
                __assert_fail("f>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                              ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
              }
              if ((p->vFinFon).nSize <= iVar6) goto LAB_003ba06f;
              piVar1 = (p->vFinFon).pArray;
              uVar7 = uVar7 & 0xffffffff;
              if (piVar1[uVar7] != 0) {
                __assert_fail("Cba_ObjFinFon(p, i, k)== 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                              ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
              }
              piVar1[uVar7] = iVar5;
              iVar5 = Cba_FonRangeSize(p,iVar5);
              iVar9 = iVar9 + iVar5;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < Prs_CatSignals_V_1);
          iVar9 = iVar9 + -1;
        }
        if ((int)uVar3 < (p->vObjFon0).nSize) {
          piVar1 = (p->vObjFon0).pArray;
          uVar4 = piVar1[uVar3];
          iVar9 = Hash_Int2ManInsert(p->pDesign->vHash,iVar9,0,(int)piVar1);
          if ((p->vFonRange).nSize < 1) {
            __assert_fail("Cba_NtkHasFonRanges(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                          ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
          }
          if (iVar9 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntFillExtra(&p->vFonRange,uVar4 + 1,Fill_01);
          if (((int)uVar4 < 0) || ((p->vFonRange).nSize <= (int)uVar4)) goto LAB_003ba0cc;
          (p->vFonRange).pArray[uVar4] = iVar9 * 2;
          if ((int)uVar3 < (p->vObjFon0).nSize) {
            return (p->vObjFon0).pArray[uVar3];
          }
        }
      }
    }
  }
LAB_003ba06f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateCatIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Con )
{
    extern int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig );
    int i, Sig, iObj, iFon, NameId, nBits = 0;
    Vec_Int_t * vSigs = Prs_CatSignals(pNtk, Con);
    // create input concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, Vec_IntSize(vSigs), 1 );
    iFon = Cba_ObjFon0(p, iObj);
    //sprintf( Buffer, "_icc%d_", iObj );
    //NameId = Cba_NtkNewStrId( p, Buffer );
    NameId = Cba_NtkNewStrId( p, "_icc%d_", iObj );
    Cba_FonSetName( p, iFon, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    // set inputs
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        iFon = Prs_CreateSignalIn( p, pNtk, Sig );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, i, iFon );
        if ( iFon )
            nBits += Cba_FonRangeSize( p, iFon );
    }
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, nBits-1, 0) );
    return Cba_ObjFon0(p, iObj);
}